

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int fts5UpdateMethod(sqlite3_vtab *pVtab,int nArg,sqlite3_value **apVal,sqlite_int64 *pRowid)

{
  _func_int_sqlite3_vtab_ptr_char_ptr_char_ptr_int_char_ptr_ptr **pp_Var1;
  uint uVar2;
  uint uVar3;
  Fts5Config *pFVar4;
  Mem *pMVar5;
  sqlite3_module *psVar6;
  bool bVar7;
  int iVar8;
  int iVar9;
  Fts5Config *pFVar10;
  uchar *puVar11;
  i64 iDel;
  sqlite3_int64 iRowid;
  sqlite3_value *psVar12;
  uchar *puVar13;
  Fts5Structure *pFVar14;
  Fts5Structure *pFVar15;
  i64 iVar16;
  ulong uVar17;
  sqlite3_value **apVal_00;
  int ii;
  long lVar18;
  uint uVar19;
  ulong uVar20;
  char *pcVar21;
  Fts5Storage *pFVar22;
  int iVar23;
  sqlite3_stmt *pStmt;
  long lVar24;
  Fts5Index *p;
  ushort uVar25;
  long in_FS_OFFSET;
  bool bVar26;
  int rc;
  int local_84;
  uchar *local_80;
  int nLoc;
  char *pText;
  int nText;
  int local_64;
  Fts5Storage *local_60;
  undefined8 local_58;
  sqlite3_stmt *pScan;
  Fts5Structure *pNew;
  ulong uStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pFVar4 = (Fts5Config *)pVtab[1].pModule;
  rc = 0;
  pFVar10 = pFVar4;
  if (pFVar4->pgsz == 0) {
    rc = sqlite3Fts5ConfigLoad(pFVar4,pFVar4->iCookie);
    if (rc != 0) goto LAB_001bef90;
    pFVar10 = (Fts5Config *)pVtab[1].pModule;
  }
  pFVar10->pzErrmsg = &pVtab->zErrMsg;
  fts5TripCursors((Fts5FullTable *)pVtab);
  uVar25 = (*apVal)->flags & 0x3f;
  if (((0xaaaaaaaaaaaaaaaaU >> uVar25 & 1) == 0) ||
     (psVar12 = apVal[(long)pFVar4->nCol + 2], uVar19._0_2_ = psVar12->flags,
     uVar19._2_1_ = psVar12->enc, uVar19._3_1_ = psVar12->eSubtype,
     (0xaaaaaaaaaaaaaaaaU >> ((ulong)uVar19 & 0x3f) & 1) != 0)) {
    if ((pFVar4->eContent == 0) || (pFVar4->bContentlessDelete != 0)) {
      bVar26 = pFVar4->db->vtabOnConflict == '\x05';
    }
    else {
      bVar26 = false;
    }
    if (nArg == 1) {
      if ((((ulong)(pVtab[1].pModule)->xNext & 0xfffffffd) == 1) &&
         (pFVar4->bContentlessDelete == 0)) {
        fts5SetVtabError((Fts5FullTable *)pVtab,"cannot DELETE from contentless fts5 table: %s",
                         pFVar4->zName);
        goto LAB_001be95c;
      }
      iVar16 = sqlite3VdbeIntValue(*apVal);
      pFVar22 = (Fts5Storage *)pVtab[1].zErrMsg;
      apVal_00 = (sqlite3_value **)0x0;
LAB_001be790:
      iVar8 = sqlite3Fts5StorageDelete(pFVar22,iVar16,apVal_00,0);
    }
    else {
      iVar8 = sqlite3_value_numeric_type(apVal[1]);
      if (pFVar4->bLocale == 0) {
        lVar18 = 0;
        do {
          if (pFVar4->nCol <= lVar18) goto LAB_001be7b9;
          iVar9 = sqlite3Fts5IsLocaleValue(pFVar4,apVal[lVar18 + 2]);
          lVar18 = lVar18 + 1;
        } while (iVar9 == 0);
        fts5SetVtabError((Fts5FullTable *)pVtab,"fts5_locale() requires locale=1");
        rc = 0x14;
        iVar8 = rc;
      }
      else {
LAB_001be7b9:
        if ((0x50505050UL >> uVar25 & 1) == 0) {
          if ((bool)(bVar26 & iVar8 == 1)) {
            iVar16 = sqlite3VdbeIntValue(apVal[1]);
            rc = sqlite3Fts5StorageDelete
                           ((Fts5Storage *)pVtab[1].zErrMsg,iVar16,(sqlite3_value **)0x0,0);
          }
          fts5StorageInsert(&rc,(Fts5FullTable *)pVtab,apVal,pRowid);
          iVar8 = rc;
        }
        else {
          pFVar22 = (Fts5Storage *)pVtab[1].zErrMsg;
          iVar16 = sqlite3VdbeIntValue(*apVal);
          iDel = sqlite3VdbeIntValue(apVal[1]);
          bVar7 = true;
          if (((ulong)(pVtab[1].pModule)->xNext & 0xfffffffd) == 1) {
            uVar20 = 0;
            uVar17 = (ulong)(uint)pFVar4->nCol;
            if (pFVar4->nCol < 1) {
              uVar17 = uVar20;
            }
            iVar9 = 0;
            iVar23 = 0;
            for (; uVar17 != uVar20; uVar20 = uVar20 + 1) {
              if (pFVar4->abUnindexed[uVar20] == '\0') {
                psVar12 = apVal[uVar20 + 2];
                uVar2._0_2_ = psVar12->flags;
                uVar2._2_1_ = psVar12->enc;
                uVar2._3_1_ = psVar12->eSubtype;
                if ((~uVar2 & 0x401) == 0) {
                  iVar23 = iVar23 + 1;
                }
                else {
                  iVar9 = iVar9 + 1;
                }
              }
            }
            bVar7 = iVar9 != 0 || iVar16 != iDel;
            if (iVar9 != 0 || iVar16 != iDel) {
              if (iVar23 == 0) {
                if (pFVar4->bContentlessDelete != 0) goto LAB_001bec9b;
                pcVar21 = "%s contentless fts5 table: %s";
              }
              else {
                pcVar21 = "%s a subset of columns on fts5 contentless-delete table: %s";
                if (pFVar4->bContentlessDelete == 0) {
                  pcVar21 = "%s contentless fts5 table: %s";
                }
              }
              sqlite3Fts5ConfigErrmsg(pFVar4,pcVar21,"cannot UPDATE",pFVar4->zName);
              goto LAB_001be95c;
            }
          }
LAB_001bec9b:
          if (iVar8 == 1) {
            if (iVar16 == iDel) {
              if (bVar7) {
                rc = sqlite3Fts5StorageDelete(pFVar22,iVar16,(sqlite3_value **)0x0,1);
LAB_001bed3a:
                fts5StorageInsert(&rc,(Fts5FullTable *)pVtab,apVal,pRowid);
              }
              else {
                rc = sqlite3Fts5StorageFindDeleteRow(pFVar22,iVar16);
                if (rc == 0) {
                  rc = sqlite3Fts5StorageContentInsert(pFVar22,1,apVal,pRowid);
                }
              }
            }
            else {
              if (bVar26) {
                rc = sqlite3Fts5StorageDelete(pFVar22,iVar16,(sqlite3_value **)0x0,1);
                if (rc == 0) {
                  rc = sqlite3Fts5StorageDelete(pFVar22,iDel,(sqlite3_value **)0x0,0);
                }
                goto LAB_001bed3a;
              }
              rc = sqlite3Fts5StorageFindDeleteRow(pFVar22,iVar16);
              if (((rc == 0) &&
                  (rc = sqlite3Fts5StorageContentInsert(pFVar22,0,apVal,pRowid), rc == 0)) &&
                 (rc = sqlite3Fts5StorageDelete(pFVar22,iVar16,(sqlite3_value **)0x0,0), rc == 0)) {
                rc = sqlite3Fts5StorageIndexInsert(pFVar22,apVal,*pRowid);
              }
            }
          }
          else {
            rc = 0x14;
          }
          sqlite3_reset(pFVar22->pSavedRow);
          pFVar22->pSavedRow = (sqlite3_stmt *)0x0;
          iVar8 = rc;
        }
      }
    }
  }
  else {
    puVar11 = sqlite3_value_text(psVar12);
    if ((pFVar4->eContent == 0) || (iVar8 = sqlite3_stricmp("delete",(char *)puVar11), iVar8 != 0))
    {
      pMVar5 = apVal[(long)pFVar4->nCol + 3];
      psVar6 = pVtab[1].pModule;
      local_84 = 0;
      iVar8 = sqlite3_stricmp("delete-all",(char *)puVar11);
      if (iVar8 == 0) {
        if (*(int *)&psVar6->xNext != 0) {
          iVar8 = sqlite3Fts5StorageDeleteAll((Fts5Storage *)pVtab[1].zErrMsg);
          goto LAB_001bec43;
        }
        pcVar21 = 
        "\'delete-all\' may only be used with a contentless or external content fts5 table";
LAB_001be9ce:
        fts5SetVtabError((Fts5FullTable *)pVtab,pcVar21);
      }
      else {
        iVar8 = sqlite3_stricmp("rebuild",(char *)puVar11);
        if (iVar8 == 0) {
          if (((ulong)psVar6->xNext & 0xfffffffd) != 1) {
            pFVar22 = (Fts5Storage *)pVtab[1].zErrMsg;
            pNew = (Fts5Structure *)0x0;
            uStack_40 = 0;
            pFVar4 = pFVar22->pConfig;
            pScan = (sqlite3_stmt *)0x0;
            local_58 = 0;
            local_60 = pFVar22;
            iVar8 = sqlite3Fts5StorageDeleteAll(pFVar22);
            if ((iVar8 == 0) && (iVar8 = fts5StorageLoadTotals(pFVar22,1), iVar8 == 0)) {
              iVar8 = fts5StorageGetStmt(pFVar22,0xb,&pScan,pFVar4->pzErrmsg);
              pStmt = pScan;
            }
            else {
              pStmt = (sqlite3_stmt *)0x0;
            }
LAB_001bea32:
            do {
              if ((iVar8 != 0) || (iVar9 = sqlite3_step(pStmt), iVar9 != 100)) goto LAB_001bec23;
              uVar19 = 0;
              iRowid = sqlite3_column_int64(pStmt,0);
              uStack_40 = uStack_40 & 0xffffffff00000000;
              local_64 = sqlite3Fts5IndexBeginWrite(pFVar22->pIndex,0,iRowid);
              while( true ) {
                local_58 = CONCAT44(local_58._4_4_,uVar19);
                if (local_64 != 0) break;
                if (pFVar4->nCol <= (int)uVar19) {
                  pFVar22->nTotalRow = pFVar22->nTotalRow + 1;
                  local_64 = fts5StorageInsertDocsize(pFVar22,iRowid,(Fts5Buffer *)&pNew);
                  iVar8 = local_64;
                  goto LAB_001bea32;
                }
                local_58 = (ulong)uVar19;
                if (pFVar4->abUnindexed[(int)uVar19] == '\0') {
                  nText = 0;
                  pText = (char *)0x0;
                  nLoc = 0;
                  local_80 = (uchar *)0x0;
                  psVar12 = sqlite3_column_value(pStmt,uVar19 + 1);
                  if ((pFVar4->eContent == 2) &&
                     (iVar8 = sqlite3Fts5IsLocaleValue(pFVar4,psVar12), iVar8 != 0)) {
                    local_64 = sqlite3Fts5DecodeLocaleValue
                                         (psVar12,&pText,&nText,(char **)&local_80,&nLoc);
                    puVar11 = (uchar *)pText;
                    puVar13 = local_80;
                    iVar9 = nLoc;
                    iVar8 = nText;
                    if (local_64 == 0) goto LAB_001beb7c;
                  }
                  else {
                    puVar11 = sqlite3_value_text(psVar12);
                    pText = (char *)puVar11;
                    iVar8 = sqlite3_value_bytes(psVar12);
                    nText = iVar8;
                    if (pFVar4->bLocale == 0) {
                      puVar13 = (uchar *)0x0;
                      iVar9 = 0;
                    }
                    else {
                      iVar9 = (int)local_58 + pFVar4->nCol + 1;
                      puVar13 = sqlite3_column_text(pStmt,iVar9);
                      local_80 = puVar13;
                      nLoc = sqlite3_column_bytes(pStmt,iVar9);
                      iVar9 = nLoc;
                    }
LAB_001beb7c:
                    (pFVar4->t).pLocale = (char *)puVar13;
                    (pFVar4->t).nLocale = iVar9;
                    local_64 = sqlite3Fts5Tokenize(pFVar4,4,(char *)puVar11,iVar8,&local_60,
                                                   fts5StorageInsertCallback);
                    (pFVar4->t).pLocale = (char *)0x0;
                    (pFVar4->t).nLocale = 0;
                  }
                  iVar16 = (i64)local_58._4_4_;
                }
                else {
                  iVar16 = 0;
                }
                sqlite3Fts5BufferAppendVarint(&local_64,(Fts5Buffer *)&pNew,iVar16);
                pFVar22->aTotalSize[(int)local_58] =
                     pFVar22->aTotalSize[(int)local_58] + (long)local_58._4_4_;
                uVar19 = (int)local_58 + 1;
              }
              pFVar22->nTotalRow = pFVar22->nTotalRow + 1;
              iVar8 = local_64;
            } while( true );
          }
          pcVar21 = "\'rebuild\' may not be used with a contentless fts5 table";
          goto LAB_001be9ce;
        }
        iVar8 = sqlite3_stricmp("optimize",(char *)puVar11);
        if (iVar8 == 0) {
          p = *(Fts5Index **)(pVtab[1].zErrMsg + 8);
          pNew = (Fts5Structure *)0x0;
          fts5IndexFlush(p);
          pFVar14 = fts5StructureRead(p);
          fts5StructureInvalidate(p);
          if (pFVar14 == (Fts5Structure *)0x0) {
            pFVar15 = (Fts5Structure *)0x0;
          }
          else {
            pFVar15 = fts5IndexOptimizeStruct(p,pFVar14);
            pNew = pFVar15;
          }
          fts5StructureRelease(pFVar14);
          if (pFVar15 != (Fts5Structure *)0x0) {
            iVar8 = -1;
            lVar18 = 0x24;
            do {
              lVar24 = lVar18;
              iVar8 = iVar8 + 1;
              lVar18 = lVar24 + 0x10;
            } while (*(int *)((long)&((Fts5Structure *)(pFVar15->aLevel + -2))->nRef + lVar24) == 0)
            ;
            while ((p->rc == 0 &&
                   (0 < *(int *)((long)&((Fts5Structure *)(pFVar15->aLevel + -2))->nRef + lVar24))))
            {
              local_60 = (Fts5Storage *)CONCAT44(local_60._4_4_,1000);
              fts5IndexMergeLevel(p,&pNew,iVar8,(int *)&local_60);
              pFVar15 = pNew;
            }
            fts5StructureWrite(p,pFVar15);
            fts5StructureRelease(pFVar15);
          }
LAB_001bef73:
          iVar8 = p->rc;
          p->rc = 0;
          goto LAB_001bef80;
        }
        iVar8 = sqlite3_stricmp("merge",(char *)puVar11);
        if (iVar8 == 0) {
          iVar16 = sqlite3VdbeIntValue(pMVar5);
          iVar8 = (int)iVar16;
          p = *(Fts5Index **)(pVtab[1].zErrMsg + 8);
          fts5IndexFlush(p);
          pFVar14 = fts5StructureRead(p);
          pNew = pFVar14;
          if (pFVar14 == (Fts5Structure *)0x0) goto LAB_001bef73;
          iVar9 = p->pConfig->nUsermerge;
          fts5StructureInvalidate(p);
          if (iVar8 < 0) {
            pFVar15 = fts5IndexOptimizeStruct(p,pFVar14);
            fts5StructureRelease(pFVar14);
            pNew = pFVar15;
            if (pFVar15 != (Fts5Structure *)0x0) {
              iVar8 = -iVar8;
              iVar9 = 1;
              pFVar14 = pFVar15;
              goto LAB_001bedbc;
            }
            pFVar14 = (Fts5Structure *)0x0;
          }
          else {
LAB_001bedbc:
            if ((pFVar14->nLevel != 0) &&
               (iVar8 = fts5IndexMerge(p,&pNew,iVar8,iVar9), pFVar14 = pNew, iVar8 != 0)) {
              fts5StructureWrite(p,pNew);
            }
          }
          fts5StructureRelease(pFVar14);
          goto LAB_001bef73;
        }
        iVar8 = sqlite3_stricmp("integrity-check",(char *)puVar11);
        if (iVar8 == 0) {
          iVar16 = sqlite3VdbeIntValue(pMVar5);
          iVar8 = sqlite3Fts5StorageIntegrity((Fts5Storage *)pVtab[1].zErrMsg,(int)iVar16);
          goto LAB_001bef80;
        }
        iVar9 = sqlite3_stricmp("flush",(char *)puVar11);
        iVar8 = sqlite3Fts5FlushToDisk((Fts5Table *)pVtab);
        if (((iVar8 != 0 || iVar9 == 0) ||
            (iVar8 = sqlite3Fts5IndexLoadConfig(*(Fts5Index **)&pVtab[1].nRef), iVar8 != 0)) ||
           (iVar8 = sqlite3Fts5ConfigSetValue
                              ((Fts5Config *)pVtab[1].pModule,(char *)puVar11,pMVar5,&local_84),
           iVar8 != 0)) goto LAB_001bef80;
        if (local_84 == 0) {
          iVar8 = sqlite3Fts5StorageConfigValue
                            ((Fts5Storage *)pVtab[1].zErrMsg,(char *)puVar11,pMVar5,0);
          goto LAB_001bef80;
        }
      }
      iVar8 = 1;
    }
    else {
      if (pFVar4->bContentlessDelete == 0) {
        pMVar5 = apVal[1];
        uVar3._0_2_ = pMVar5->flags;
        uVar3._2_1_ = pMVar5->enc;
        uVar3._3_1_ = pMVar5->eSubtype;
        iVar8 = 0;
        if ((0x50505050UL >> ((ulong)uVar3 & 0x3f) & 1) != 0) {
          iVar16 = sqlite3VdbeIntValue(pMVar5);
          pFVar22 = (Fts5Storage *)pVtab[1].zErrMsg;
          apVal_00 = apVal + 2;
          goto LAB_001be790;
        }
        goto LAB_001bef80;
      }
      fts5SetVtabError((Fts5FullTable *)pVtab,
                       "\'delete\' may not be used with a contentless_delete=1 table");
LAB_001be95c:
      rc = 1;
      iVar8 = rc;
    }
  }
  goto LAB_001bef80;
LAB_001bec23:
  sqlite3_free(pNew);
  iVar9 = sqlite3_reset(pStmt);
  if ((iVar8 == 0) && (iVar8 = iVar9, iVar9 == 0)) {
    iVar8 = fts5StorageSaveTotals(pFVar22);
  }
LAB_001bec43:
  if (iVar8 == 0) {
    pp_Var1 = &(pVtab[1].pModule)->xIntegrity;
    *(int *)pp_Var1 = *(int *)pp_Var1 + -1;
    iVar8 = sqlite3Fts5IndexLoadConfig(*(Fts5Index **)&pVtab[1].nRef);
  }
LAB_001bef80:
  rc = iVar8;
  pVtab[1].pModule[1].xOpen = (_func_int_sqlite3_vtab_ptr_sqlite3_vtab_cursor_ptr_ptr *)0x0;
LAB_001bef90:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return rc;
}

Assistant:

static int fts5UpdateMethod(
  sqlite3_vtab *pVtab,            /* Virtual table handle */
  int nArg,                       /* Size of argument array */
  sqlite3_value **apVal,          /* Array of arguments */
  sqlite_int64 *pRowid            /* OUT: The affected (or effected) rowid */
){
  Fts5FullTable *pTab = (Fts5FullTable*)pVtab;
  Fts5Config *pConfig = pTab->p.pConfig;
  int eType0;                     /* value_type() of apVal[0] */
  int rc = SQLITE_OK;             /* Return code */

  /* A transaction must be open when this is called. */
  assert( pTab->ts.eState==1 || pTab->ts.eState==2 );

  assert( pVtab->zErrMsg==0 );
  assert( nArg==1 || nArg==(2+pConfig->nCol+2) );
  assert( sqlite3_value_type(apVal[0])==SQLITE_INTEGER
       || sqlite3_value_type(apVal[0])==SQLITE_NULL
  );
  assert( pTab->p.pConfig->pzErrmsg==0 );
  if( pConfig->pgsz==0 ){
    rc = sqlite3Fts5ConfigLoad(pTab->p.pConfig, pTab->p.pConfig->iCookie);
    if( rc!=SQLITE_OK ) return rc;
  }

  pTab->p.pConfig->pzErrmsg = &pTab->p.base.zErrMsg;

  /* Put any active cursors into REQUIRE_SEEK state. */
  fts5TripCursors(pTab);

  eType0 = sqlite3_value_type(apVal[0]);
  if( eType0==SQLITE_NULL
   && sqlite3_value_type(apVal[2+pConfig->nCol])!=SQLITE_NULL
  ){
    /* A "special" INSERT op. These are handled separately. */
    const char *z = (const char*)sqlite3_value_text(apVal[2+pConfig->nCol]);
    if( pConfig->eContent!=FTS5_CONTENT_NORMAL
      && 0==sqlite3_stricmp("delete", z)
    ){
      if( pConfig->bContentlessDelete ){
        fts5SetVtabError(pTab,
            "'delete' may not be used with a contentless_delete=1 table"
        );
        rc = SQLITE_ERROR;
      }else{
        rc = fts5SpecialDelete(pTab, apVal);
      }
    }else{
      rc = fts5SpecialInsert(pTab, z, apVal[2 + pConfig->nCol + 1]);
    }
  }else{
    /* A regular INSERT, UPDATE or DELETE statement. The trick here is that
    ** any conflict on the rowid value must be detected before any
    ** modifications are made to the database file. There are 4 cases:
    **
    **   1) DELETE
    **   2) UPDATE (rowid not modified)
    **   3) UPDATE (rowid modified)
    **   4) INSERT
    **
    ** Cases 3 and 4 may violate the rowid constraint.
    */
    int eConflict = SQLITE_ABORT;
    if( pConfig->eContent==FTS5_CONTENT_NORMAL || pConfig->bContentlessDelete ){
      eConflict = sqlite3_vtab_on_conflict(pConfig->db);
    }

    assert( eType0==SQLITE_INTEGER || eType0==SQLITE_NULL );
    assert( nArg!=1 || eType0==SQLITE_INTEGER );

    /* DELETE */
    if( nArg==1 ){
      /* It is only possible to DELETE from a contentless table if the
      ** contentless_delete=1 flag is set. */
      if( fts5IsContentless(pTab, 1) && pConfig->bContentlessDelete==0 ){
        fts5SetVtabError(pTab,
            "cannot DELETE from contentless fts5 table: %s", pConfig->zName
        );
        rc = SQLITE_ERROR;
      }else{
        i64 iDel = sqlite3_value_int64(apVal[0]);  /* Rowid to delete */
        rc = sqlite3Fts5StorageDelete(pTab->pStorage, iDel, 0, 0);
      }
    }

    /* INSERT or UPDATE */
    else{
      int eType1 = sqlite3_value_numeric_type(apVal[1]);

      /* It is an error to write an fts5_locale() value to a table without
      ** the locale=1 option. */
      if( pConfig->bLocale==0 ){
        int ii;
        for(ii=0; ii<pConfig->nCol; ii++){
          sqlite3_value *pVal = apVal[ii+2];
          if( sqlite3Fts5IsLocaleValue(pConfig, pVal) ){
            fts5SetVtabError(pTab, "fts5_locale() requires locale=1");
            rc = SQLITE_MISMATCH;
            goto update_out;
          }
        }
      }

      if( eType0!=SQLITE_INTEGER ){
        /* An INSERT statement. If the conflict-mode is REPLACE, first remove
        ** the current entry (if any). */
        if( eConflict==SQLITE_REPLACE && eType1==SQLITE_INTEGER ){
          i64 iNew = sqlite3_value_int64(apVal[1]);  /* Rowid to delete */
          rc = sqlite3Fts5StorageDelete(pTab->pStorage, iNew, 0, 0);
        }
        fts5StorageInsert(&rc, pTab, apVal, pRowid);
      }

      /* UPDATE */
      else{
        Fts5Storage *pStorage = pTab->pStorage;
        i64 iOld = sqlite3_value_int64(apVal[0]);  /* Old rowid */
        i64 iNew = sqlite3_value_int64(apVal[1]);  /* New rowid */
        int bContent = 0;         /* Content only update */

        /* If this is a contentless table (including contentless_unindexed=1
        ** tables), check if the UPDATE may proceed.  */
        if( fts5IsContentless(pTab, 1) ){
          rc = fts5ContentlessUpdate(pConfig, &apVal[2], iOld!=iNew, &bContent);
          if( rc!=SQLITE_OK ) goto update_out;
        }

        if( eType1!=SQLITE_INTEGER ){
          rc = SQLITE_MISMATCH;
        }else if( iOld!=iNew ){
          assert( bContent==0 );
          if( eConflict==SQLITE_REPLACE ){
            rc = sqlite3Fts5StorageDelete(pStorage, iOld, 0, 1);
            if( rc==SQLITE_OK ){
              rc = sqlite3Fts5StorageDelete(pStorage, iNew, 0, 0);
            }
            fts5StorageInsert(&rc, pTab, apVal, pRowid);
          }else{
            rc = sqlite3Fts5StorageFindDeleteRow(pStorage, iOld);
            if( rc==SQLITE_OK ){
              rc = sqlite3Fts5StorageContentInsert(pStorage, 0, apVal, pRowid);
            }
            if( rc==SQLITE_OK ){
              rc = sqlite3Fts5StorageDelete(pStorage, iOld, 0, 0);
            }
            if( rc==SQLITE_OK ){
              rc = sqlite3Fts5StorageIndexInsert(pStorage, apVal, *pRowid);
            }
          }
        }else if( bContent ){
          /* This occurs when an UPDATE on a contentless table affects *only*
          ** UNINDEXED columns. This is a no-op for contentless_unindexed=0
          ** tables, or a write to the %_content table only for =1 tables.  */
          assert( fts5IsContentless(pTab, 1) );
          rc = sqlite3Fts5StorageFindDeleteRow(pStorage, iOld);
          if( rc==SQLITE_OK ){
            rc = sqlite3Fts5StorageContentInsert(pStorage, 1, apVal, pRowid);
          }
        }else{
          rc = sqlite3Fts5StorageDelete(pStorage, iOld, 0, 1);
          fts5StorageInsert(&rc, pTab, apVal, pRowid);
        }
        sqlite3Fts5StorageReleaseDeleteRow(pStorage);
      }
    }
  }

 update_out:
  pTab->p.pConfig->pzErrmsg = 0;
  return rc;
}